

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_31::HttpClientAdapter::ResponseImpl::~ResponseImpl(ResponseImpl *this)

{
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&this->task);
  Own<kj::PromiseFulfiller<kj::HttpClient::Response>_>::dispose(&this->fulfiller);
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

ResponseImpl(kj::HttpMethod method,
                 kj::Own<kj::PromiseFulfiller<HttpClient::Response>> fulfiller)
        : method(method), fulfiller(kj::mv(fulfiller)) {}